

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrEventDataDisplayRefreshRateChangedFB *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  XrStructureType __val;
  uint uVar6;
  bool bVar7;
  char *pcVar8;
  XrInstance pXVar9;
  invalid_argument *this;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint __len;
  string type_prefix;
  string next_prefix;
  string todisplayrefreshrate_prefix;
  string fromdisplayrefreshrate_prefix;
  ostringstream oss_fromDisplayRefreshRate;
  ostringstream oss_toDisplayRefreshRate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  long *local_3c8;
  long local_3c0;
  long local_3b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  ios_base local_2b8 [272];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  paVar1 = &local_328.field_2;
  local_328._M_dataplus._M_p = (pointer)paVar1;
  local_1a8._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_328,'\x12');
  *local_328._M_dataplus._M_p = '0';
  local_328._M_dataplus._M_p[1] = 'x';
  pcVar8 = local_328._M_dataplus._M_p + (local_328._M_string_length - 1);
  lVar11 = 0;
  do {
    bVar2 = local_1a8[lVar11];
    *pcVar8 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar8[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar11 = lVar11 + 1;
    pcVar8 = pcVar8 + -2;
  } while (lVar11 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != paVar1) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3e8,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_3e8);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    __len = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar12 = (ulong)__val;
      uVar6 = 4;
      do {
        __len = uVar6;
        uVar10 = (uint)uVar12;
        if (uVar10 < 100) {
          __len = __len - 2;
          goto LAB_0014f557;
        }
        if (uVar10 < 1000) {
          __len = __len - 1;
          goto LAB_0014f557;
        }
        if (uVar10 < 10000) goto LAB_0014f557;
        uVar12 = uVar12 / 10000;
        uVar6 = __len + 4;
      } while (99999 < uVar10);
      __len = __len + 1;
    }
LAB_0014f557:
    local_328._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_328,(char)__len - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_328._M_dataplus._M_p + (XVar3 >> 0x1f),__len,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_3e8,&local_328);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_2f8 = 0;
    uStack_2f0 = 0;
    local_308 = 0;
    uStack_300 = 0;
    local_328.field_2._M_allocated_capacity = 0;
    local_328.field_2._8_8_ = 0;
    local_328._M_dataplus._M_p = (pointer)0x0;
    local_328._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar9 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar9,value->type,(char *)&local_328);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_3e8,(char (*) [64])&local_328);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_3c8 = local_3b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_3c8);
  value_00 = value->next;
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_3c8,local_3c0 + (long)local_3c8);
  bVar7 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_368,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    pcVar4 = (prefix->_M_dataplus)._M_p;
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_388,pcVar4,pcVar4 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_388);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
    *(undefined8 *)
     ((long)&local_328._M_string_length + *(long *)(local_328._M_dataplus._M_p + -0x18)) = 0x20;
    std::ostream::_M_insert<double>((double)value->fromDisplayRefreshRate);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&local_388,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    if ((XrEventDataDisplayRefreshRateChangedFB *)local_1a8._0_8_ !=
        (XrEventDataDisplayRefreshRateChangedFB *)(local_1a8 + 0x10)) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar4 = (prefix->_M_dataplus)._M_p;
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a8,pcVar4,pcVar4 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_3a8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(undefined8 *)(local_1a8 + *(long *)(local_1a8._0_8_ + -0x18) + 8) = 0x20;
    std::ostream::_M_insert<double>((double)value->toDisplayRefreshRate);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&local_3a8,&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
    std::ios_base::~ios_base(local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if (local_3c8 != local_3b8) {
      operator_delete(local_3c8,local_3b8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrEventDataDisplayRefreshRateChangedFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string fromdisplayrefreshrate_prefix = prefix;
        fromdisplayrefreshrate_prefix += "fromDisplayRefreshRate";
        std::ostringstream oss_fromDisplayRefreshRate;
        oss_fromDisplayRefreshRate << std::setprecision(32) << (value->fromDisplayRefreshRate);
        contents.emplace_back("float", fromdisplayrefreshrate_prefix, oss_fromDisplayRefreshRate.str());
        std::string todisplayrefreshrate_prefix = prefix;
        todisplayrefreshrate_prefix += "toDisplayRefreshRate";
        std::ostringstream oss_toDisplayRefreshRate;
        oss_toDisplayRefreshRate << std::setprecision(32) << (value->toDisplayRefreshRate);
        contents.emplace_back("float", todisplayrefreshrate_prefix, oss_toDisplayRefreshRate.str());
        return true;
    } catch(...) {
    }
    return false;
}